

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O2

void d68020_cptrapcc_0(m68k_info *info)

{
  uint *puVar1;
  uint uVar2;
  
  if ((info->type & 0x1c) != 0) {
    uVar2 = read_imm_16(info);
    build_init_op(info,0xee,0,0);
    puVar1 = &info->inst->Opcode;
    *puVar1 = *puVar1 + (uVar2 & 0x2f);
    return;
  }
  d68000_invalid(info);
  return;
}

Assistant:

static void d68020_cptrapcc_0(m68k_info *info)
{
	uint extension1;
	LIMIT_CPU_TYPES(info, M68020_PLUS);

	extension1 = read_imm_16(info);

	build_init_op(info, M68K_INS_FTRAPF, 0, 0);

	// these are all in row with the extension so just doing a add here is fine
	info->inst->Opcode += (extension1 & 0x2f);
}